

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_bf16.h
# Opt level: O3

void ncnn::cast_bf16_to_fp32_sse_avx512bf16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [64];
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  
  iVar1 = bottom_blob->c;
  if (0 < (long)iVar1) {
    uVar5 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
    lVar7 = 0;
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      pauVar8 = (undefined1 (*) [32])
                (bottom_blob->cstep * lVar7 * bottom_blob->elemsize + (long)bottom_blob->data);
      pauVar9 = (undefined1 (*) [64])
                (top_blob->cstep * lVar7 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar5 < 0x10) {
        uVar11 = 0;
      }
      else {
        iVar10 = 0xf;
        do {
          auVar17 = vpmovzxwd_avx512f(*pauVar8);
          auVar17 = vpslld_avx512f(auVar17,0x10);
          auVar17 = vmovdqu64_avx512f(auVar17);
          *pauVar9 = auVar17;
          pauVar8 = pauVar8 + 1;
          pauVar9 = pauVar9 + 1;
          iVar10 = iVar10 + 0x10;
          uVar11 = uVar5 & 0xfffffff0;
        } while (iVar10 < (int)uVar5);
      }
      uVar6 = uVar11 | 7;
      while ((int)uVar6 < (int)uVar5) {
        auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])*pauVar8);
        auVar21 = vpslld_avx2(auVar21,0x10);
        *(undefined1 (*) [32])*pauVar9 = auVar21;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x20);
        uVar6 = uVar11 + 0xf;
        uVar11 = uVar11 + 8;
      }
      uVar6 = uVar11 | 3;
      while ((int)uVar6 < (int)uVar5) {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)*pauVar8;
        auVar20 = vpunpcklwd_avx((undefined1  [16])0x0,auVar20);
        *(undefined1 (*) [16])*pauVar9 = auVar20;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 8);
        pauVar9 = (undefined1 (*) [64])(*pauVar9 + 0x10);
        uVar6 = uVar11 + 7;
        uVar11 = uVar11 + 4;
      }
      if ((int)uVar11 < (int)uVar5) {
        auVar17 = vpbroadcastq_avx512f();
        uVar12 = 0;
        do {
          auVar18 = vpbroadcastq_avx512f();
          auVar19 = vporq_avx512f(auVar18,auVar15);
          auVar18 = vporq_avx512f(auVar18,auVar16);
          uVar2 = vpcmpuq_avx512f(auVar18,auVar17,2);
          uVar3 = vpcmpuq_avx512f(auVar19,auVar17,2);
          bVar4 = (byte)uVar3;
          uVar13 = CONCAT11(bVar4,(byte)uVar2);
          auVar21 = vmovdqu16_avx512vl(*(undefined1 (*) [32])(*pauVar8 + uVar12 * 2));
          auVar14._2_2_ = (ushort)((byte)(uVar13 >> 1) & 1) * auVar21._2_2_;
          auVar14._0_2_ = (ushort)((byte)uVar2 & 1) * auVar21._0_2_;
          auVar14._4_2_ = (ushort)((byte)(uVar13 >> 2) & 1) * auVar21._4_2_;
          auVar14._6_2_ = (ushort)((byte)(uVar13 >> 3) & 1) * auVar21._6_2_;
          auVar14._8_2_ = (ushort)((byte)(uVar13 >> 4) & 1) * auVar21._8_2_;
          auVar14._10_2_ = (ushort)((byte)(uVar13 >> 5) & 1) * auVar21._10_2_;
          auVar14._12_2_ = (ushort)((byte)(uVar13 >> 6) & 1) * auVar21._12_2_;
          auVar14._14_2_ = (ushort)((byte)(uVar13 >> 7) & 1) * auVar21._14_2_;
          auVar14._16_2_ = (ushort)(bVar4 & 1) * auVar21._16_2_;
          auVar14._18_2_ = (ushort)(bVar4 >> 1 & 1) * auVar21._18_2_;
          auVar14._20_2_ = (ushort)(bVar4 >> 2 & 1) * auVar21._20_2_;
          auVar14._22_2_ = (ushort)(bVar4 >> 3 & 1) * auVar21._22_2_;
          auVar14._24_2_ = (ushort)(bVar4 >> 4 & 1) * auVar21._24_2_;
          auVar14._26_2_ = (ushort)(bVar4 >> 5 & 1) * auVar21._26_2_;
          auVar14._28_2_ = (ushort)(bVar4 >> 6 & 1) * auVar21._28_2_;
          auVar14._30_2_ = (ushort)(bVar4 >> 7) * auVar21._30_2_;
          auVar18 = vpmovzxwd_avx512f(auVar14);
          auVar18 = vpslld_avx512f(auVar18,0x10);
          auVar18 = vmovdqu32_avx512f(auVar18);
          *(undefined1 (*) [64])(*pauVar9 + uVar12 * 4) = auVar18;
          uVar12 = uVar12 + 0x10;
        } while (((ulong)(~uVar11 + uVar5) + 0x10 & 0xfffffffffffffff0) != uVar12);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

static void cast_bf16_to_fp32_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_AVX512BF16 && __AVX512F__ && !__AVX512BF16__
    if (ncnn::cpu_support_x86_avx512_bf16())
    {
        cast_bf16_to_fp32_sse_avx512bf16(bottom_blob, top_blob, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        cast_bf16_to_fp32_sse_avx2(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned short* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            _mm512_storeu_ps(outptr, bfloat2float_avx512(_mm256_loadu_si256((const __m256i*)ptr)));
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            _mm256_storeu_ps(outptr, bfloat2float_avx(_mm_loadu_si128((const __m128i*)ptr)));
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            _mm_storeu_ps(outptr, bfloat2float_sse(_mm_loadl_epi64((const __m128i*)ptr)));
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr++ = bfloat16_to_float32(*ptr++);
        }
    }
}